

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_pointers_t.c
# Opt level: O1

void run_tests(int mode,char *mode_desc)

{
  MMDB_description_s *pMVar1;
  char *db_file;
  MMDB_s *mmdb;
  ulong uVar2;
  ushort uVar3;
  
  db_file = test_database_path("MaxMind-DB-test-metadata-pointers.mmdb");
  mmdb = open_ok(db_file,mode,mode_desc);
  free(db_file);
  is_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/metadata_pointers_t.c"
            ,0xd,(mmdb->metadata).database_type,"Lots of pointers in metadata",
            "decoded pointer database_type",0);
  if ((mmdb->metadata).description.count != 0) {
    uVar3 = 1;
    uVar2 = 0;
    do {
      pMVar1 = (mmdb->metadata).description.descriptions[uVar2];
      is_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/metadata_pointers_t.c"
                ,0x14,pMVar1->description,"Lots of pointers in metadata","%s description",
                pMVar1->language,0);
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 < (mmdb->metadata).description.count);
  }
  MMDB_close(mmdb);
  free(mmdb);
  return;
}

Assistant:

void run_tests(int mode, const char *mode_desc) {
    const char *filename = "MaxMind-DB-test-metadata-pointers.mmdb";
    char *path = test_database_path(filename);
    MMDB_s *mmdb = open_ok(path, mode, mode_desc);
    free(path);

    char *repeated_string = "Lots of pointers in metadata";

    is(mmdb->metadata.database_type,
       repeated_string,
       "decoded pointer database_type");

    for (uint16_t i = 0; i < mmdb->metadata.description.count; i++) {
        const char *language =
            mmdb->metadata.description.descriptions[i]->language;
        const char *description =
            mmdb->metadata.description.descriptions[i]->description;
        is(description, repeated_string, "%s description", language);
    }

    MMDB_close(mmdb);
    free(mmdb);
}